

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O1

void __thiscall
tchecker::clock_updates_map_t::clock_updates_map_t(clock_updates_map_t *this,size_t clock_nb)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>> *this_01;
  ulong uVar1;
  undefined1 local_71;
  int_expression_t *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  int local_5c;
  shared_ptr<const_tchecker::expression_t> local_58;
  clock_update_t local_48;
  
  std::vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
  vector(&this->_map,clock_nb,(allocator_type *)&local_48);
  if (clock_nb != 0) {
    uVar1 = 0;
    do {
      this_01 = (vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>> *)
                ((this->_map).
                 super__Vector_base<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar1);
      local_5c = 0;
      local_70 = (int_expression_t *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<tchecker::int_expression_t,std::allocator<tchecker::int_expression_t>,int>
                (&_Stack_68,&local_70,(allocator<tchecker::int_expression_t> *)&local_71,&local_5c);
      this_00._M_pi = _Stack_68._M_pi;
      if (local_70 == (int_expression_t *)0x0) {
        local_58.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
      }
      else {
        local_58.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)((long)&local_70->field_0x0 + *(long *)(*(long *)local_70 + -0x38));
      }
      local_58.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_68._M_pi;
      local_70 = (int_expression_t *)0x0;
      _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      clock_update_t::clock_update_t(&local_48,(clock_id_t)uVar1,&local_58);
      std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::clear
                ((vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_> *)
                 this_01);
      std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>::
      emplace_back<tchecker::clock_update_t_const&>(this_01,&local_48);
      if (local_48._value.
          super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48._value.
                   super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
      }
      uVar1 = (ulong)((clock_id_t)uVar1 + 1);
    } while (uVar1 < clock_nb);
  }
  return;
}

Assistant:

clock_updates_map_t::clock_updates_map_t(std::size_t clock_nb) : _map(clock_nb)
{
  for (tchecker::clock_id_t x = 0; x < clock_nb; ++x)
    _map[x].set(tchecker::clock_update_t{x, std::make_shared<tchecker::int_expression_t>(0)});
}